

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

void __thiscall
QSocks5SocketEnginePrivate::~QSocks5SocketEnginePrivate(QSocks5SocketEnginePrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  *(undefined ***)&this->super_QAbstractSocketEnginePrivate =
       &PTR__QSocks5SocketEnginePrivate_002d02d0;
  pDVar1 = (this->receivedHeaderFragment).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->receivedHeaderFragment).d.d)->super_QArrayData,1,0x10);
    }
  }
  pDVar2 = (this->peerName).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->peerName).d.d)->super_QArrayData,2,0x10);
    }
  }
  QNetworkProxy::~QNetworkProxy(&this->proxyInfo);
  *(undefined ***)&this->super_QAbstractSocketEnginePrivate =
       &PTR__QAbstractSocketEnginePrivate_002cca40;
  QHostAddress::~QHostAddress(&(this->super_QAbstractSocketEnginePrivate).peerAddress);
  QHostAddress::~QHostAddress(&(this->super_QAbstractSocketEnginePrivate).localAddress);
  pDVar2 = (this->super_QAbstractSocketEnginePrivate).socketErrorString.d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate
                (&((this->super_QAbstractSocketEnginePrivate).socketErrorString.d.d)->
                  super_QArrayData,2,0x10);
    }
  }
  QObjectPrivate::~QObjectPrivate((QObjectPrivate *)this);
  return;
}

Assistant:

QSocks5SocketEnginePrivate::~QSocks5SocketEnginePrivate()
{
}